

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O2

Location * __thiscall trieste::wf::Gen::location(Location *__return_storage_ptr__,Gen *this,Node *n)

{
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&n->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
  CLI::std::
  function<trieste::Location_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&,_std::shared_ptr<trieste::NodeDef>)>
  ::operator()(__return_storage_ptr__,
               (function<trieste::Location_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&,_std::shared_ptr<trieste::NodeDef>)>
                *)&this->gloc,&this->rand,(shared_ptr<trieste::NodeDef> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Location location(Node n)
      {
        return gloc(rand, n);
      }